

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O2

UBool __thiscall icu_63::NFRule::operator==(NFRule *this,NFRule *rhs)

{
  UBool UVar1;
  
  if (this->baseValue != rhs->baseValue) {
    return '\0';
  }
  if ((((this->radix == rhs->radix) && (this->exponent == rhs->exponent)) &&
      (UVar1 = UnicodeString::operator==(&this->fRuleText,&rhs->fRuleText), UVar1 != '\0')) &&
     (UVar1 = util_equalSubstitutions(this->sub1,rhs->sub1), UVar1 != '\0')) {
    UVar1 = util_equalSubstitutions(this->sub2,rhs->sub2);
    return UVar1 != '\0';
  }
  return '\0';
}

Assistant:

UBool
NFRule::operator==(const NFRule& rhs) const
{
    return baseValue == rhs.baseValue
        && radix == rhs.radix
        && exponent == rhs.exponent
        && fRuleText == rhs.fRuleText
        && util_equalSubstitutions(sub1, rhs.sub1)
        && util_equalSubstitutions(sub2, rhs.sub2);
}